

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,char (*arg) [13],unsigned_long *arg_1)

{
  size_t sVar1;
  string_view data;
  string result;
  char *local_b0;
  size_t local_a8;
  char local_a0;
  undefined7 uStack_9f;
  Output *local_90;
  size_t local_88;
  char (*local_80) [13];
  long local_78;
  char *local_70;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  local_90 = this;
  sVar1 = strlen(*arg);
  local_78 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*arg_1,local_50);
  local_78 = local_78 - (long)local_50;
  local_a8 = 0;
  local_a0 = '\0';
  local_b0 = &local_a0;
  local_88 = sVar1;
  local_80 = arg;
  local_70 = local_50;
  local_60 = local_78;
  local_58 = local_50;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_b0,format._M_len,format._M_str,&local_88,2);
  data._M_str = local_b0;
  data._M_len = local_a8;
  Write(local_90,data);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }